

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

void ScaKwdHdr(GmfMshSct *msh,int KwdCod)

{
  int *piVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  int local_34;
  
  uVar5 = (byte)*GmfKwdFmt[KwdCod][1] - 0x69;
  if (uVar5 == 0) {
    uVar5 = (uint)(byte)GmfKwdFmt[KwdCod][1][1];
  }
  if (uVar5 == 0) {
    if ((msh->typ & 1) == 0) {
      if (msh->ver < 4) {
        ScaWrd(msh,&local_34);
        msh->KwdTab[KwdCod].NmbLin = (long)local_34;
      }
      else {
        ScaDblWrd(msh,&msh->KwdTab[KwdCod].NmbLin);
      }
    }
    else {
      iVar3 = __isoc99_fscanf(msh->hdl,"%ld",&msh->KwdTab[KwdCod].NmbLin);
      if (iVar3 != 1) goto LAB_0010e35e;
    }
  }
  else {
    msh->KwdTab[KwdCod].NmbLin = 1;
  }
  pbVar2 = (byte *)GmfKwdFmt[KwdCod][2];
  uVar5 = *pbVar2 - 0x73;
  if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
    uVar5 = (uint)pbVar2[2];
  }
  if (uVar5 != 0) {
    uVar5 = *pbVar2 - 0x68;
    if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
      uVar5 = (uint)pbVar2[2];
    }
    if (uVar5 != 0) goto LAB_0010e42c;
  }
  if ((msh->typ & 1) != 0) {
    piVar1 = &msh->KwdTab[KwdCod].NmbTyp;
    iVar3 = __isoc99_fscanf(msh->hdl,"%d",piVar1);
    if (iVar3 == 1) {
      lVar7 = -1;
      piVar6 = msh->KwdTab[KwdCod].TypTab;
      do {
        lVar7 = lVar7 + 1;
        if (*piVar1 <= lVar7) {
          pbVar2 = (byte *)GmfKwdFmt[KwdCod][2];
          uVar5 = *pbVar2 - 0x68;
          if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
            uVar5 = (uint)pbVar2[2];
          }
          if (uVar5 != 0) {
            msh->KwdTab[KwdCod].deg = 0;
            msh->KwdTab[KwdCod].NmbNod = 1;
            goto LAB_0010e42c;
          }
          iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->KwdTab[KwdCod].deg);
          if ((iVar3 == 1) &&
             (iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->KwdTab[KwdCod].NmbNod), iVar3 == 1))
          goto LAB_0010e42c;
          break;
        }
        iVar3 = __isoc99_fscanf(msh->hdl,"%d",piVar6);
        piVar6 = piVar6 + 1;
      } while (iVar3 == 1);
    }
LAB_0010e35e:
    longjmp((__jmp_buf_tag *)msh->err,-1);
  }
  piVar1 = &msh->KwdTab[KwdCod].NmbTyp;
  ScaWrd(msh,piVar1);
  piVar6 = msh->KwdTab[KwdCod].TypTab;
  for (lVar7 = 0; lVar7 < *piVar1; lVar7 = lVar7 + 1) {
    ScaWrd(msh,piVar6);
    piVar6 = piVar6 + 1;
  }
  pbVar2 = (byte *)GmfKwdFmt[KwdCod][2];
  uVar5 = *pbVar2 - 0x68;
  if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
    uVar5 = (uint)pbVar2[2];
  }
  piVar1 = &msh->KwdTab[KwdCod].deg;
  piVar6 = &msh->KwdTab[KwdCod].NmbNod;
  if (uVar5 == 0) {
    ScaWrd(msh,piVar1);
    ScaWrd(msh,piVar6);
  }
  else {
    *piVar1 = 0;
    *piVar6 = 1;
  }
LAB_0010e42c:
  ExpFmt(msh,KwdCod);
  sVar4 = GetFilPos(msh);
  msh->KwdTab[KwdCod].pos = sVar4;
  return;
}

Assistant:

static void ScaKwdHdr(GmfMshSct *msh, int KwdCod)
{
   int      i;
   KwdSct   *kwd = &msh->KwdTab[ KwdCod ];

   if(!strcmp("i", GmfKwdFmt[ KwdCod ][1]))
      if(msh->typ & Asc)
         safe_fscanf(msh->hdl, INT64_T_FMT, &kwd->NmbLin, msh->err);
      else
         if(msh->ver <= 3)
         {
            ScaWrd(msh, (unsigned char *)&i);
            kwd->NmbLin = i;
         }
         else
            ScaDblWrd(msh, (unsigned char *)&kwd->NmbLin);
   else
      kwd->NmbLin = 1;

   if(!strcmp("sr", GmfKwdFmt[ KwdCod ][2])
   || !strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
   {
      if(msh->typ & Asc)
      {
         safe_fscanf(msh->hdl, "%d", &kwd->NmbTyp, msh->err);

         for(i=0;i<kwd->NmbTyp;i++)
            safe_fscanf(msh->hdl, "%d", &kwd->TypTab[i], msh->err);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            safe_fscanf(msh->hdl, "%d", &kwd->deg, msh->err);
            safe_fscanf(msh->hdl, "%d", &kwd->NmbNod, msh->err);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }

      }
      else
      {
         ScaWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
            ScaWrd(msh, (unsigned char *)&kwd->TypTab[i]);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            ScaWrd(msh, (unsigned char *)&kwd->deg);
            ScaWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }
      }
   }

   ExpFmt(msh, KwdCod);
   kwd->pos = GetFilPos(msh);
}